

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::add_implied_read_expression(Compiler *this,SPIRExpression *e,uint32_t source)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  TypedID<(spirv_cross::Types)0> local_18;
  uint32_t local_14;
  
  pTVar1 = (e->implied_read_expressions).
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_14 = source;
  pTVar1 = ::std::
           __find_if<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                     (pTVar1,pTVar1 + (e->implied_read_expressions).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                      .buffer_size);
  if (pTVar1 == (e->implied_read_expressions).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr +
                (e->implied_read_expressions).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size) {
    _local_18 = CONCAT44(local_14,source);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
              (&e->implied_read_expressions,&local_18);
  }
  return;
}

Assistant:

void Compiler::add_implied_read_expression(SPIRExpression &e, uint32_t source)
{
	auto itr = find(begin(e.implied_read_expressions), end(e.implied_read_expressions), ID(source));
	if (itr == end(e.implied_read_expressions))
		e.implied_read_expressions.push_back(source);
}